

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O1

string * __thiscall
slang::CommandLine::Option::set_abi_cxx11_
          (string *__return_storage_ptr__,Option *this,
          vector<double,_std::allocator<double>_> *target,string_view name,string_view value)

{
  iterator __position;
  optional<double> oVar1;
  _Storage<double,_true> local_28;
  undefined1 local_20;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  oVar1 = parseDouble(name,value,__return_storage_ptr__);
  local_28 = oVar1.super__Optional_base<double,_true,_true>._M_payload.
             super__Optional_payload_base<double>._M_payload;
  local_20 = oVar1.super__Optional_base<double,_true,_true>._M_payload.
             super__Optional_payload_base<double>._M_engaged;
  if (((undefined1  [16])
       oVar1.super__Optional_base<double,_true,_true>._M_payload.
       super__Optional_payload_base<double> & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    __position._M_current = *(double **)(target + 8);
    if (__position._M_current == *(double **)(target + 0x10)) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)target,__position,&local_28._M_value);
    }
    else {
      *__position._M_current = (double)local_28;
      *(double **)(target + 8) = __position._M_current + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CommandLine::Option::set(std::vector<double>& target, string_view name,
                                     string_view value) {
    std::string error;
    auto result = parseDouble(name, value, error);
    if (result)
        target.push_back(*result);
    return error;
}